

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall t_go_generator::generate_service_interface(t_go_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  t_function *tfunction;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ostream *poVar4;
  string *this_00;
  pointer pptVar5;
  string local_1f0;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string extends_if;
  string extends;
  string serviceName;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string interfaceName;
  string local_50;
  
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&extends_if);
  std::__cxx11::string::string((string *)&extends_if,"",(allocator *)&serviceName);
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  publicize(&serviceName,this,(string *)CONCAT44(extraout_var,iVar2),false);
  std::__cxx11::string::string((string *)&interfaceName,(string *)&serviceName);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_1f0,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&extends,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    lVar3 = std::__cxx11::string::rfind((char *)&extends,0x2fd4e8);
    if (lVar3 == -1) {
      t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions
                     ,"\n",&local_190);
      publicize(&local_170,this,&extends,false);
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions
                     ,&local_170);
      std::operator+(&local_1f0,&local_1b0,"\n");
      std::__cxx11::string::operator=((string *)&extends_if,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&functions);
      this_00 = &local_190;
    }
    else {
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      std::operator+(&local_170,"\n",&local_90);
      std::operator+(&local_190,&local_170,"  ");
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&extends);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions
                     ,&local_190,&local_b0);
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)&extends);
      publicize(&local_d0,this,&local_f0,false);
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions
                     ,&local_d0);
      std::operator+(&local_1f0,&local_1b0,"\n");
      std::__cxx11::string::operator=((string *)&extends_if,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&functions);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
      this_00 = &local_90;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
  out = &this->f_types_;
  poVar4 = std::operator<<((ostream *)out,(string *)&local_1f0);
  poVar4 = std::operator<<(poVar4,"type ");
  poVar4 = std::operator<<(poVar4,(string *)&interfaceName);
  poVar4 = std::operator<<(poVar4," interface {");
  std::operator<<(poVar4,(string *)&extends_if);
  std::__cxx11::string::~string((string *)&local_1f0);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  generate_go_docstring(this,(ostream *)out,(t_doc *)tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  if (functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    for (pptVar5 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        pptVar5 !=
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      generate_go_docstring(this,(ostream *)out,*pptVar5);
      t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)out,(string *)&local_1f0);
      tfunction = *pptVar5;
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_190);
      function_signature_if(&local_1b0,this,tfunction,&local_50,true);
      poVar4 = std::operator<<(poVar4,(string *)&local_1b0);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
  poVar4 = std::operator<<((ostream *)out,(string *)&local_1f0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  std::__cxx11::string::~string((string *)&interfaceName);
  std::__cxx11::string::~string((string *)&serviceName);
  std::__cxx11::string::~string((string *)&extends_if);
  std::__cxx11::string::~string((string *)&extends);
  return;
}

Assistant:

void t_go_generator::generate_service_interface(t_service* tservice) {
  string extends = "";
  string extends_if = "";
  string serviceName(publicize(tservice->get_name()));
  string interfaceName = serviceName;

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    size_t index = extends.rfind(".");

    if (index != string::npos) {
      extends_if = "\n" + indent() + "  " + extends.substr(0, index + 1)
                   + publicize(extends.substr(index + 1)) + "\n";
    } else {
      extends_if = "\n" + indent() + publicize(extends) + "\n";
    }
  }

  f_types_ << indent() << "type " << interfaceName << " interface {" << extends_if;
  indent_up();
  generate_go_docstring(f_types_, tservice);
  vector<t_function*> functions = tservice->get_functions();

  if (!functions.empty()) {
    f_types_ << endl;
    vector<t_function*>::iterator f_iter;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      generate_go_docstring(f_types_, (*f_iter));
      f_types_ << indent() << function_signature_if(*f_iter, "", true) << endl;
    }
  }

  indent_down();
  f_types_ << indent() << "}" << endl << endl;
}